

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

StringRef llvm::Triple::getArchTypePrefix(ArchType Kind)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  StringRef SVar4;
  
  uVar3 = Kind - arm;
  pcVar1 = (char *)0x0;
  sVar2 = 0;
  if (uVar3 < 0x30) {
    pcVar1 = *(char **)(&DAT_001d6fd0 + (ulong)uVar3 * 8);
    sVar2 = *(size_t *)(&DAT_001a5a08 + (ulong)uVar3 * 8);
  }
  SVar4.Length = sVar2;
  SVar4.Data = pcVar1;
  return SVar4;
}

Assistant:

StringRef Triple::getArchTypePrefix(ArchType Kind) {
  switch (Kind) {
  default:
    return StringRef();

  case aarch64:
  case aarch64_be:  return "aarch64";

  case arc:         return "arc";

  case arm:
  case armeb:
  case thumb:
  case thumbeb:     return "arm";

  case avr:         return "avr";

  case ppc64:
  case ppc64le:
  case ppc:         return "ppc";

  case mips:
  case mipsel:
  case mips64:
  case mips64el:    return "mips";

  case nios2:       return "nios2";

  case hexagon:     return "hexagon";

  case amdgcn:      return "amdgcn";
  case r600:        return "r600";

  case bpfel:
  case bpfeb:       return "bpf";

  case sparcv9:
  case sparcel:
  case sparc:       return "sparc";

  case systemz:     return "s390";

  case x86:
  case x86_64:      return "x86";

  case xcore:       return "xcore";

  // NVPTX intrinsics are namespaced under nvvm.
  case nvptx:       return "nvvm";
  case nvptx64:     return "nvvm";

  case le32:        return "le32";
  case le64:        return "le64";

  case amdil:
  case amdil64:     return "amdil";

  case hsail:
  case hsail64:     return "hsail";

  case spir:
  case spir64:      return "spir";
  case kalimba:     return "kalimba";
  case lanai:       return "lanai";
  case shave:       return "shave";
  case wasm32:
  case wasm64:      return "wasm";

  case riscv32:
  case riscv64:     return "riscv";
  }
}